

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O3

ExceptionOr<capnp::Response<capnp::AnyPointer>_> * __thiscall
kj::_::ExceptionOr<capnp::Response<capnp::AnyPointer>_>::operator=
          (ExceptionOr<capnp::Response<capnp::AnyPointer>_> *this,
          ExceptionOr<capnp::Response<capnp::AnyPointer>_> *param_1)

{
  ResponseHook *pRVar1;
  Disposer *pDVar2;
  SegmentReader *pSVar3;
  CapTableReader *pCVar4;
  NullableValue<capnp::Response<capnp::AnyPointer>_> *pNVar5;
  int iVar6;
  undefined4 uVar7;
  
  ExceptionOrValue::operator=(&this->super_ExceptionOrValue,&param_1->super_ExceptionOrValue);
  if (param_1 != this) {
    if ((this->value).ptr.isSet == true) {
      (this->value).ptr.isSet = false;
      pRVar1 = (this->value).ptr.field_1.value.hook.ptr;
      if (pRVar1 != (ResponseHook *)0x0) {
        (this->value).ptr.field_1.value.hook.ptr = (ResponseHook *)0x0;
        pDVar2 = (this->value).ptr.field_1.value.hook.disposer;
        (**pDVar2->_vptr_Disposer)
                  (pDVar2,(_func_int *)
                          ((long)&pRVar1->_vptr_ResponseHook + (long)pRVar1->_vptr_ResponseHook[-2])
                  );
      }
    }
    if ((param_1->value).ptr.isSet == true) {
      pSVar3 = (param_1->value).ptr.field_1.value.super_Reader.reader.segment;
      pCVar4 = (param_1->value).ptr.field_1.value.super_Reader.reader.capTable;
      pNVar5 = &(param_1->value).ptr;
      iVar6 = *(int *)((long)&pNVar5->field_1 + 0x18);
      uVar7 = *(undefined4 *)((long)&pNVar5->field_1 + 0x1c);
      (this->value).ptr.field_1.value.super_Reader.reader.pointer =
           (param_1->value).ptr.field_1.value.super_Reader.reader.pointer;
      pNVar5 = &(this->value).ptr;
      *(int *)((long)&pNVar5->field_1 + 0x18) = iVar6;
      *(undefined4 *)((long)&pNVar5->field_1 + 0x1c) = uVar7;
      (this->value).ptr.field_1.value.super_Reader.reader.segment = pSVar3;
      (this->value).ptr.field_1.value.super_Reader.reader.capTable = pCVar4;
      pRVar1 = (param_1->value).ptr.field_1.value.hook.ptr;
      (this->value).ptr.field_1.value.hook.disposer =
           (param_1->value).ptr.field_1.value.hook.disposer;
      (this->value).ptr.field_1.value.hook.ptr = pRVar1;
      (param_1->value).ptr.field_1.value.hook.ptr = (ResponseHook *)0x0;
      (this->value).ptr.isSet = true;
    }
  }
  return this;
}

Assistant:

ExceptionOr& operator=(ExceptionOr&&) = default;